

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_archive.cpp
# Opt level: O1

void my_serialization_example(ChArchiveOut *marchive)

{
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  *puVar1;
  double dVar2;
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  *puVar3;
  int iVar4;
  _List_node_base *p_Var5;
  mapped_type *pmVar6;
  myEmployeeBoss *this;
  myEmployeeCustomConstructor *this_00;
  mapped_type *pmVar7;
  vector<double,_std::allocator<double>_> m_stlvector;
  vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_> vect_of_pointers;
  _wrap_pair<int,_double> mpair;
  int m_int;
  ChVector<double> *mvp2;
  ChVector<double> *mvp1;
  shared_ptr<myEmployeeBoss> s_boss;
  myEmployeeBoss *a_boss;
  shared_ptr<myEmployee> s_boss_b;
  ChMatrixDynamic<double> m_matr_dyn;
  string m_string;
  ChVector<double> *a_vect;
  char m_text [12];
  double m_double;
  list<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> m_stllist;
  shared_ptr<myEmployeeBoss> null_boss;
  pair<int,_double> m_stlpair;
  ChVector<double> m_vect;
  myEmployeeBoss m_boss;
  ChMatrixNM<double,_2,_3> m_matr_NM;
  double m_array [3];
  myEmployeeCustomConstructor *mcustomconstr;
  myEmployeeBoss *a_boss2;
  ChVector<double> *a_null_ptr;
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  m_stlunorderedmap;
  ChQuaternion<double> m_quat;
  undefined1 local_2d8 [32];
  undefined1 local_2b8 [8];
  ChVector<double> **ppCStack_2b0;
  ChVector<double> **local_2a8;
  undefined1 local_2a0 [32];
  ChVector<double> *local_280;
  _List_node_base *local_278;
  undefined1 local_270 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_268;
  undefined1 local_260 [8];
  undefined1 local_258 [16];
  undefined1 local_248 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  undefined8 local_220 [2];
  undefined1 local_210 [8];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1d0;
  _List_node_base local_1c8;
  undefined1 local_1b8 [24];
  undefined1 local_1a0 [24];
  myEnum local_188;
  _Alloc_hider local_180;
  variable_if_dynamic<long,__1> local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  undefined1 local_160 [24];
  variable_if_dynamic<long,__1> local_148;
  variable_if_dynamic<long,__1> local_140;
  _Alloc_hider local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  scalar_constant_op<double> local_118;
  variable_if_dynamic<long,__1> local_108;
  variable_if_dynamic<long,__1> local_100;
  scalar_constant_op<double> local_f8;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  undefined1 local_b8 [40];
  _func_int **local_90;
  _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_88;
  __buckets_ptr local_50;
  _func_int **pp_Stack_48;
  __node_base _Stack_40;
  double dStack_38;
  
  local_1f8._0_8_ = (pointer)0x3fbf9acffa7eb6bf;
  local_2a0._28_4_ = 0xffffff85;
  local_b8._0_8_ = 13.1;
  local_b8._8_8_ = 15.3;
  local_b8._16_8_ = 16.5;
  local_208._0_8_ = (pointer)0x7274732074736574;
  local_208._8_4_ = 0x676e69;
  local_230._M_allocated_capacity = (size_type)local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"hey! stl string","");
  local_2d8._0_8_ = (pointer)0x0;
  local_2d8._8_8_ = (double *)0x0;
  local_2d8._16_8_ = (double *)0x0;
  local_1a0._0_8_ = (_func_int **)0x4002666666666666;
  std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
            ((vector<double,_std::allocator<double>_> *)local_2d8,(iterator)0x0,(double *)local_1a0)
  ;
  local_1a0._0_8_ = (_func_int **)0x4046a66666666666;
  if (local_2d8._8_8_ == local_2d8._16_8_) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              ((vector<double,_std::allocator<double>_> *)local_2d8,(iterator)local_2d8._8_8_,
               (double *)local_1a0);
  }
  else {
    *(double *)local_2d8._8_8_ = 45.3;
    local_2d8._8_8_ = local_2d8._8_8_ + 8;
  }
  local_1a0._0_8_ = (_func_int **)0x40509c28f5c28f5c;
  if (local_2d8._8_8_ == local_2d8._16_8_) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              ((vector<double,_std::allocator<double>_> *)local_2d8,(iterator)local_2d8._8_8_,
               (double *)local_1a0);
  }
  else {
    *(double *)local_2d8._8_8_ = 66.44;
    local_2d8._8_8_ = local_2d8._8_8_ + 8;
  }
  local_1f8._8_8_ = local_1f8 + 8;
  local_1e8._8_8_ = 0;
  local_1e8._0_8_ = local_1f8._8_8_;
  p_Var5 = (_List_node_base *)operator_new(0x28);
  p_Var5[1]._M_next = (_List_node_base *)0x3ff0000000000000;
  p_Var5[1]._M_prev = (_List_node_base *)0x4000000000000000;
  p_Var5[2]._M_next = (_List_node_base *)0x4008000000000000;
  std::__detail::_List_node_base::_M_hook(p_Var5);
  local_1e8._8_8_ = local_1e8._8_8_ + 1;
  p_Var5 = (_List_node_base *)operator_new(0x28);
  p_Var5[1]._M_next = (_List_node_base *)0x4008000000000000;
  p_Var5[1]._M_prev = (_List_node_base *)0x4010000000000000;
  p_Var5[2]._M_next = (_List_node_base *)0x4014000000000000;
  std::__detail::_List_node_base::_M_hook(p_Var5);
  local_1e8._8_8_ = local_1e8._8_8_ + 1;
  local_1c8._M_next._0_4_ = 0x78;
  local_1c8._M_prev = (_List_node_base *)0x3fefae147ae147ae;
  local_88._M_buckets = &local_88._M_single_bucket;
  local_88._M_bucket_count = 1;
  local_88._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_88._M_element_count = 0;
  local_88._M_rehash_policy._M_max_load_factor = 1.0;
  local_88._M_rehash_policy._M_next_resize = 0;
  local_88._M_single_bucket = (__node_base_ptr)0x0;
  local_1a0._0_4_ = 0xc;
  pmVar6 = std::__detail::
           _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&local_88,(key_type *)local_1a0);
  *pmVar6 = 11.2;
  local_1a0._0_4_ = 0x29;
  pmVar6 = std::__detail::
           _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&local_88,(key_type *)local_1a0);
  *pmVar6 = 44.8;
  local_1a0._0_4_ = 0x22;
  pmVar6 = std::__detail::
           _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&local_88,(key_type *)local_1a0);
  *pmVar6 = 33.6;
  local_248._0_8_ = (double *)0x0;
  local_248._8_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_248._16_8_ = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
            ((DenseStorage<double,__1,__1,__1,_1> *)local_248,0xf,3,5);
  if ((long)(local_248._16_8_ | local_248._8_8_) < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_random_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
                 );
  }
  local_180._M_p = (pointer)local_248._8_8_;
  local_178.m_value = local_248._16_8_;
  local_170._8_8_ = local_248._8_8_;
  local_160._0_8_ = local_248._16_8_;
  local_160._8_8_ = 1.0;
  local_148.m_value = local_248._8_8_;
  local_140.m_value = local_248._16_8_;
  local_138._M_p = (pointer)0x3fe0000000000000;
  local_128._M_allocated_capacity = local_248._8_8_;
  local_128._8_8_ = local_248._16_8_;
  local_118.m_other = 10.0;
  local_108.m_value = local_248._8_8_;
  local_100.m_value = local_248._16_8_;
  local_f8.m_other = 0.0;
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>>const>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,__1,_1,__1,__1> *)local_248,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
              *)local_1a0,(assign_op<double,_double> *)&local_e8);
  iVar4 = rand();
  dVar2 = (((double)iVar4 + (double)iVar4) / 2147483647.0 + -1.0 + 1.0) * 0.5;
  local_e8 = dVar2 + dVar2 + -1.0;
  iVar4 = rand();
  dVar2 = (((double)iVar4 + (double)iVar4) / 2147483647.0 + -1.0 + 1.0) * 0.5;
  local_e0 = dVar2 + dVar2 + -1.0;
  iVar4 = rand();
  dVar2 = (((double)iVar4 + (double)iVar4) / 2147483647.0 + -1.0 + 1.0) * 0.5;
  local_d8 = dVar2 + dVar2 + -1.0;
  iVar4 = rand();
  dVar2 = (((double)iVar4 + (double)iVar4) / 2147483647.0 + -1.0 + 1.0) * 0.5;
  local_d0 = dVar2 + dVar2 + -1.0;
  iVar4 = rand();
  dVar2 = (((double)iVar4 + (double)iVar4) / 2147483647.0 + -1.0 + 1.0) * 0.5;
  local_c8 = dVar2 + dVar2 + -1.0;
  iVar4 = rand();
  dVar2 = (((double)iVar4 + (double)iVar4) / 2147483647.0 + -1.0 + 1.0) * 0.5;
  local_c0 = dVar2 + dVar2 + -1.0;
  local_1b8._0_8_ = (__buckets_ptr)0x3fe0000000000000;
  local_1b8._8_8_ = 0x3fe3333333333333;
  local_1b8._16_8_ = (_Hash_node_base *)0x3fe6666666666666;
  local_50 = (__buckets_ptr)0x3fb999999999999a;
  pp_Stack_48 = (_func_int **)0x3fc999999999999a;
  _Stack_40._M_nxt = (_Hash_node_base *)0x3fd3333333333333;
  dStack_38 = 0.4;
  local_1a0._0_8_ = "custom_double";
  local_1a0._8_8_ = local_1f8;
  local_1a0[0x10] = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive);
  local_1a0._0_8_ = "m_int";
  local_1a0._8_8_ = local_2a0 + 0x1c;
  local_1a0[0x10] = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[3])(marchive);
  local_1a0._0_8_ = "m_array";
  local_1a0._8_8_ = local_b8;
  local_1a0[0x10] = '\0';
  chrono::ChArchiveOut::out<double,3ul>(marchive,(ChNameValue<double[3]> *)local_1a0);
  local_1a0._0_8_ = "m_text";
  local_1a0._8_8_ = local_208;
  local_1a0[0x10] = '\0';
  chrono::ChArchiveOut::out<char,12ul>(marchive,(ChNameValue<char[12]> *)local_1a0);
  local_1a0._0_8_ = "m_string";
  local_1a0._8_8_ = &local_230;
  local_1a0[0x10] = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[8])(marchive);
  local_1a0._0_8_ = "m_stlvector";
  local_1a0[0x10] = '\0';
  local_1a0._8_8_ =
       (unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
        *)local_2d8;
  chrono::ChArchiveOut::out<double>
            (marchive,(ChNameValue<std::vector<double,_std::allocator<double>_>_> *)local_1a0);
  local_1a0._0_8_ = "m_stllist";
  local_1a0[0x10] = '\0';
  local_1a0._8_8_ =
       (unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
        *)(local_1f8 + 8);
  chrono::ChArchiveOut::out<chrono::ChVector<double>>
            (marchive,(ChNameValue<std::__cxx11::list<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>
                       *)local_1a0);
  local_2a0._0_8_ = &local_1c8;
  local_1a0._8_8_ = local_2a0;
  local_1a0._0_8_ = "m_stlpair";
  local_1a0[0x10] = '\0';
  chrono::ChArchiveOut::out<chrono::_wrap_pair<int,double>>
            (marchive,(ChNameValue<chrono::_wrap_pair<int,_double>_> *)local_1a0);
  local_1a0._0_8_ = "m_stlunorderedmap";
  local_1a0._8_8_ = &local_88;
  local_1a0[0x10] = '\0';
  chrono::ChArchiveOut::out<int,double>
            (marchive,(ChNameValue<std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>
                       *)local_1a0);
  local_1a0._0_8_ = "m_matr_dyn";
  local_1a0[0x10] = '\0';
  local_1a0._8_8_ =
       (unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
        *)local_248;
  chrono::ChArchiveOut::out<Eigen::Matrix<double,_1,_1,1,_1,_1>>
            (marchive,(ChNameValue<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)local_1a0);
  local_1a0._0_8_ = "m_matr_NM";
  local_1a0[0x10] = '\0';
  local_1a0._8_8_ = (assign_op<double,_double> *)&local_e8;
  chrono::ChArchiveOut::out<Eigen::Matrix<double,2,3,1,2,3>>
            (marchive,(ChNameValue<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *)local_1a0);
  local_1a0._0_8_ = "m_vect";
  local_1a0._8_8_ = local_1b8;
  local_1a0[0x10] = '\0';
  chrono::ChArchiveOut::out<chrono::ChVector<double>>
            (marchive,(ChNameValue<chrono::ChVector<double>_> *)local_1a0);
  local_1a0._0_8_ = "m_quaternion";
  local_1a0._8_8_ = &local_50;
  local_1a0[0x10] = '\x01';
  chrono::ChArchiveOut::out<chrono::ChQuaternion<double>>
            (marchive,(ChNameValue<chrono::ChQuaternion<double>_> *)local_1a0);
  myEmployeeBoss::myEmployeeBoss((myEmployeeBoss *)local_1a0,0x35,12000.34,true);
  local_188 = FAT;
  local_2a0._0_8_ = "m_boss";
  local_2a0[0x10] = '\0';
  local_2a0._8_8_ = (myEmployeeBoss *)local_1a0;
  chrono::ChArchiveOut::out<myEmployeeBoss>(marchive,(ChNameValue<myEmployeeBoss> *)local_2a0);
  local_210 = (undefined1  [8])operator_new(0x18);
  *(_func_int **)local_210 = (_func_int *)0x3ff0000000000000;
  *(_func_int **)((long)local_210 + 8) = (_func_int *)0x4000000000000000;
  *(_func_int **)((long)local_210 + 0x10) = (_func_int *)0x4008000000000000;
  local_2a0._8_8_ = local_210;
  local_2a0._0_8_ = "a_vect";
  local_2a0[0x10] = '\0';
  chrono::ChArchiveOut::out<chrono::ChVector<double>>
            (marchive,(ChNameValue<chrono::ChVector<double>_*> *)local_2a0);
  if (local_210 != (undefined1  [8])0x0) {
    operator_delete((void *)local_210,0x18);
  }
  local_2a0._8_8_ = &local_90;
  local_90 = (_func_int **)0x0;
  local_2a0._0_8_ = "a_null_ptr";
  local_2a0[0x10] = '\0';
  chrono::ChArchiveOut::out<chrono::ChVector<double>>
            (marchive,(ChNameValue<chrono::ChVector<double>_*> *)local_2a0);
  this = (myEmployeeBoss *)operator_new(0x88);
  myEmployeeBoss::myEmployeeBoss(this,0x40,22356.0,false);
  local_2a0._8_8_ = local_260;
  (this->slave).age = 0x18;
  local_2a0._0_8_ = "a_boss";
  local_2a0[0x10] = '\0';
  local_260 = (undefined1  [8])this;
  chrono::ChArchiveOut::out<myEmployeeBoss>(marchive,(ChNameValue<myEmployeeBoss_*> *)local_2a0);
  local_2a0._8_8_ = local_b8 + 0x20;
  local_b8._32_8_ = local_260;
  local_2a0._0_8_ = "a_boss2";
  local_2a0[0x10] = '\0';
  chrono::ChArchiveOut::out<myEmployeeBoss>(marchive,(ChNameValue<myEmployeeBoss_*> *)local_2a0);
  local_270 = (undefined1  [8])0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<myEmployeeBoss,std::allocator<myEmployeeBoss>>
            (&local_268,(myEmployeeBoss **)local_270,(allocator<myEmployeeBoss> *)local_2a0);
  local_2a0._0_8_ = "s_boss";
  local_2a0[0x10] = '\0';
  local_2a0._8_8_ = (myEmployeeBoss *)local_270;
  chrono::ChArchiveOut::out<myEmployeeBoss>
            (marchive,(ChNameValue<std::shared_ptr<myEmployeeBoss>_> *)local_2a0);
  local_258._0_8_ = local_270;
  local_258._8_8_ = local_268._M_pi;
  if (local_268._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_268._M_pi)->_M_use_count = (local_268._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_268._M_pi)->_M_use_count = (local_268._M_pi)->_M_use_count + 1;
    }
  }
  local_2a0._0_8_ = "s_boss_b";
  local_2a0._8_8_ = local_258;
  local_2a0[0x10] = '\0';
  chrono::ChArchiveOut::out<myEmployee>
            (marchive,(ChNameValue<std::shared_ptr<myEmployee>_> *)local_2a0);
  local_2a0._8_8_ = local_1d8;
  local_1d8 = (undefined1  [8])0x0;
  p_Stack_1d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_2a0._0_8_ = "null_boss";
  local_2a0[0x10] = '\0';
  chrono::ChArchiveOut::out<myEmployeeBoss>
            (marchive,(ChNameValue<std::shared_ptr<myEmployeeBoss>_> *)local_2a0);
  this_00 = (myEmployeeCustomConstructor *)operator_new(0x50);
  myEmployeeCustomConstructor::myEmployeeCustomConstructor(this_00,3,40.0);
  local_2a0._8_8_ = local_b8 + 0x18;
  local_2a0._0_8_ = "mcustomconstr";
  local_2a0[0x10] = '\0';
  local_b8._24_8_ = this_00;
  chrono::ChArchiveOut::out<myEmployeeCustomConstructor>
            (marchive,(ChNameValue<myEmployeeCustomConstructor_*> *)local_2a0);
  local_2b8 = (undefined1  [8])0x0;
  ppCStack_2b0 = (ChVector<double> **)0x0;
  local_2a8 = (ChVector<double> **)0x0;
  p_Var5 = (_List_node_base *)operator_new(0x18);
  p_Var5->_M_next = (_List_node_base *)0x3ff0000000000000;
  p_Var5->_M_prev = (_List_node_base *)0x4000000000000000;
  p_Var5[1]._M_next = (_List_node_base *)0x4008000000000000;
  local_278 = p_Var5;
  local_280 = (ChVector<double> *)operator_new(0x18);
  local_280->m_data[0] = 7.0;
  local_280->m_data[1] = 8.0;
  local_280->m_data[2] = 7.0;
  if (ppCStack_2b0 == local_2a8) {
    std::vector<chrono::ChVector<double>*,std::allocator<chrono::ChVector<double>*>>::
    _M_realloc_insert<chrono::ChVector<double>*const&>
              ((vector<chrono::ChVector<double>*,std::allocator<chrono::ChVector<double>*>> *)
               local_2b8,(iterator)ppCStack_2b0,(ChVector<double> **)&local_278);
  }
  else {
    *ppCStack_2b0 = (ChVector<double> *)p_Var5;
    ppCStack_2b0 = ppCStack_2b0 + 1;
  }
  if (ppCStack_2b0 == local_2a8) {
    std::vector<chrono::ChVector<double>*,std::allocator<chrono::ChVector<double>*>>::
    _M_realloc_insert<chrono::ChVector<double>*const&>
              ((vector<chrono::ChVector<double>*,std::allocator<chrono::ChVector<double>*>> *)
               local_2b8,(iterator)ppCStack_2b0,&local_280);
  }
  else {
    *ppCStack_2b0 = local_280;
    ppCStack_2b0 = ppCStack_2b0 + 1;
  }
  local_2a0._0_8_ = local_278;
  pmVar7 = std::__detail::
           _Map_base<void_*,_std::pair<void_*const,_unsigned_long>,_std::allocator<std::pair<void_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<void_*,_std::pair<void_*const,_unsigned_long>,_std::allocator<std::pair<void_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&marchive->external_ptr_id,(key_type *)local_2a0);
  *pmVar7 = 0x3e9;
  local_2a0._0_8_ = "vect_of_pointers";
  local_2a0._8_8_ = local_2b8;
  local_2a0[0x10] = '\0';
  chrono::ChArchiveOut::out<chrono::ChVector<double>*>
            (marchive,(ChNameValue<std::vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>_>
                       *)local_2a0);
  if (local_260 != (undefined1  [8])0x0) {
    (*((myEmployee *)local_260)->_vptr_myEmployee[1])();
  }
  if (local_2b8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_2b8,(long)local_2a8 - (long)local_2b8);
  }
  if (p_Stack_1d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1d0);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_);
  }
  if (local_268._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_268._M_pi);
  }
  local_1a0._0_8_ = &PTR__myEmployeeBoss_00158338;
  local_160._8_8_ = &PTR__myEmployee_00158370;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_p != &local_128) {
    operator_delete(local_138._M_p,local_128._M_allocated_capacity + 1);
  }
  local_1a0._0_8_ = &PTR__myEmployee_00158370;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_p != &local_170) {
    operator_delete(local_180._M_p,local_170._M_allocated_capacity + 1);
  }
  if ((double *)local_248._0_8_ != (double *)0x0) {
    free(*(void **)(local_248._0_8_ + -8));
  }
  std::
  _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_88);
  puVar3 = (unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
            *)local_1f8._8_8_;
  while (puVar3 != (unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                    *)(local_1f8 + 8)) {
    puVar1 = (unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
              *)((_Vector_impl_data *)&((_List_impl *)&(puVar3->_M_h)._M_buckets)->_M_node)->
                _M_start;
    operator_delete(puVar3,0x28);
    puVar3 = puVar1;
  }
  if ((pointer)local_2d8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ - local_2d8._0_8_);
  }
  if ((undefined8 *)local_230._M_allocated_capacity != local_220) {
    operator_delete((void *)local_230._M_allocated_capacity,local_220[0] + 1);
  }
  return;
}

Assistant:

void my_serialization_example(ChArchiveOut& marchive)
{
        // All basic primitives (strings, int,etc.), plus and objects that has
        // an ArchiveOUT() function defined can be serialized in archives.      

        // Write from transient data into persistent binary file
        double m_double = 0.123456;
        int m_int = -123;
        double m_array[] = {13.1, 15.3, 16.5};
        char m_text[] = "test string"; // better use std::string
        std::string m_string = "hey! stl string";
        std::vector< double > m_stlvector; 
        m_stlvector.push_back (2.3); 
        m_stlvector.push_back (45.3);
        m_stlvector.push_back (66.44);
        std::list< ChVector<> > m_stllist; 
        m_stllist.push_back ( ChVector<>(1,2,3) ); 
        m_stllist.push_back ( ChVector<>(3,4,5) );
        std::pair<int, double> m_stlpair(120, 0.99);
        std::unordered_map<int, double> m_stlunorderedmap;
        m_stlunorderedmap[12]=11.2;
        m_stlunorderedmap[41]=44.8;
        m_stlunorderedmap[34]=33.6; 
        ChMatrixDynamic<double> m_matr_dyn(3, 5);
        m_matr_dyn.fillRandom(0, 10);
		ChMatrixNM<double,2,3> m_matr_NM;
        m_matr_NM.fillRandom(-1, +1);
        ChVector<> m_vect(0.5, 0.6, 0.7);
        ChQuaternion<> m_quat(0.1, 0.2, 0.3, 0.4);
 
        marchive << CHNVP(m_double,"custom_double");  // store data n.1      
        marchive << CHNVP(m_int);     // store data n.2 
        marchive << CHNVP(m_array);   // store data n.3
        marchive << CHNVP(m_text);    // store data n....
        marchive << CHNVP(m_string);  
        marchive << CHNVP(m_stlvector);
        marchive << CHNVP(m_stllist);
        marchive << CHNVP(m_stlpair);
        marchive << CHNVP(m_stlunorderedmap);
        marchive << CHNVP(m_matr_dyn);
		marchive << CHNVP(m_matr_NM);
        marchive << CHNVP(m_vect);
        marchive << CHNVP(m_quat, "m_quaternion", NVP_TRACK_OBJECT);  
        
        // Also store a c++ object 
        // In order to use this feature, the classes must implement 
        // ArchiveIN and ArchiveOUT functions.
        myEmployeeBoss m_boss(53, 12000.34, true);
        m_boss.body = FAT;
        marchive << CHNVP(m_boss);    

        // Also store a c++ objects referenced by pointer(s).
        // One could have multiple pointers to the same object: 
        // the serialization of pointers takes care of redundancy.
        // In order to use this feature, the classes must implement 
        // ArchiveIN and ArchiveOUT functions.
        ChVector<>* a_vect = new ChVector<>(1,2,3); 
        marchive << CHNVP(a_vect);
        delete a_vect;

        // Null pointers can be serialized. They will be deserialized as null.
        ChVector<>* a_null_ptr = 0; 
        marchive << CHNVP(a_null_ptr);

        // Also store c++ objects referenced by pointer, using the
        // class abstraction (class factory) mechanism, so that it
        // can be loaded later even if we do not know if it was an object of
        // class 'myEmployee' or specialized class 'myEmployeeBoss'...
        // In order to use this feature, classes must use the CH_FACTORY_REGISTER macros, 
        // and must implement ArchiveIN() and ArchiveOUT().
        myEmployeeBoss* a_boss = new myEmployeeBoss(64, 22356, false);
        a_boss->slave.age = 24;
        marchive << CHNVP(a_boss);  //  object was referenced by pointer.

        // If another pointer shares the same object instance, you can serialize
        // it too without worrying, because the serialization system will save only
        // the first copy and following copies will just use references.

        myEmployeeBoss* a_boss2 = a_boss;
        marchive << CHNVP(a_boss2);  //  object was referenced by pointer.

        // Also store c++ objects referenced by shared pointers.
        // If classes of pointed objects used CH_FACTORY_REGISTER, class abstraction
        // will be automatically used.
        auto s_boss = chrono_types::make_shared<myEmployeeBoss>();
        marchive << CHNVP(s_boss);  //  object was referenced by shared pointer.

        // Serialize a shared pointer pointing to the same shared resource of s_boss. 
        // Note, base class works fine too, as polymorphic object.
        std::shared_ptr<myEmployee> s_boss_b(s_boss);
        marchive << CHNVP(s_boss_b);

        // Serialize null shared pointer
        std::shared_ptr<myEmployeeBoss> null_boss;
        marchive << CHNVP(null_boss); 

        // Serialize an object with non-default constructor:
        myEmployeeCustomConstructor* mcustomconstr = new myEmployeeCustomConstructor(3,40);
        marchive << CHNVP(mcustomconstr); 

        // Serialize an object where some pointers are un-linked as external, marking them with unique IDs
        std::vector<ChVector<>*> vect_of_pointers;
        ChVector<>* mvp1 = new ChVector<>(1,2,3);
        ChVector<>* mvp2 = new ChVector<>(7,8,7);
        vect_of_pointers.push_back(mvp1);
        vect_of_pointers.push_back(mvp2);
        // define that some object should not be serialized, but rather marked with ID for later rebinding
        marchive.UnbindExternalPointer(mvp1, 1001); // use unique identifier > 0
        marchive << CHNVP(vect_of_pointers);

        delete a_boss;
}